

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

pid_t __thiscall TuxProc::Process::attach(Process *this,char *processName)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  ssize_t sVar4;
  char *__s1;
  char *error;
  char symbolicPath [128];
  char truePath [4096];
  char *local_10c0;
  char local_10b8 [128];
  char local_1038 [4104];
  
  this->processID = 0;
  __dirp = opendir("/proc");
  if (__dirp != (DIR *)0x0) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      do {
        uVar3 = strtol(pdVar2->d_name,&local_10c0,10);
        if (((int)uVar3 != 0) && (*local_10c0 == '\0')) {
          snprintf(local_10b8,0x80,"/proc/%u/exe",uVar3 & 0xffffffff);
          sVar4 = readlink(local_10b8,local_1038,0x1000);
          if (sVar4 != 0) {
            local_1038[sVar4] = '\0';
            __s1 = __xpg_basename(local_1038);
            iVar1 = strcmp(__s1,processName);
            if (iVar1 == 0) {
              this->processID = (int)uVar3;
              break;
            }
          }
        }
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  return this->processID;
}

Assistant:

pid_t Process::attach(const char* processName)
{
    // ** search processes for one with processName by inspecting each /proc/<uid>/exe path

    // open proc directory
    processID = 0;
    DIR* procDirectory = opendir("/proc");
    if (!procDirectory) {
        return processID;
    }

    // parse directory files
    char* error;
    struct dirent* entry;
    while ((entry = readdir(procDirectory))) {
        // name of file is the pid
        uint32_t id = strtol(entry->d_name, &error, 10);
        if (id == 0 || *error != 0) {
            continue;
        }
        char symbolicPath[128];
        char truePath[FILENAME_MAX];

        // resolve path of exe symlink
        snprintf(symbolicPath, sizeof(symbolicPath), "/proc/%u/exe", id);
        size_t pathLength = readlink(symbolicPath, truePath, sizeof(truePath));
        if (pathLength > 0) {
            truePath[pathLength] = 0;
            // check if executable name matches supplied processName
            const char* szFileName = basename(truePath);
            if (strcmp(szFileName, processName) == 0) {
                processID = id;
                break;
            }
        }
    }
    closedir(procDirectory);
    return processID;
}